

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void ypr_mandatory(lys_ypr_ctx_conflict *pctx,uint16_t flags,void *exts,int8_t *flag)

{
  char *text;
  
  if ((flags & 0x60) != 0) {
    ypr_close_parent(pctx,flag);
    text = "true";
    if ((flags & 0x20) == 0) {
      text = "false";
    }
    ypr_substmt(pctx,LY_STMT_MANDATORY,'\0',text,exts);
    return;
  }
  return;
}

Assistant:

static void
ypr_mandatory(struct lys_ypr_ctx *pctx, uint16_t flags, void *exts, ly_bool *flag)
{
    if (flags & LYS_MAND_MASK) {
        ypr_open(pctx->out, flag);
        ypr_substmt(pctx, LY_STMT_MANDATORY, 0, (flags & LYS_MAND_TRUE) ? "true" : "false", 0, exts);
    }
}